

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

string * __thiscall common_arg::to_string_abi_cxx11_(common_arg *this)

{
  char *pcVar1;
  bool bVar2;
  reference ppcVar3;
  reference ppcVar4;
  size_type sVar5;
  ostream *poVar6;
  streamoff sVar7;
  size_type __n;
  const_reference pvVar8;
  long in_RSI;
  char *pcVar9;
  string *in_RDI;
  undefined1 auVar10 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  help_lines;
  string spaces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  char *arg;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  ostringstream ss;
  string leading_spaces;
  ostream *in_stack_fffffffffffffbf8;
  ostream *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  reference in_stack_fffffffffffffc10;
  size_type in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  bool local_31a;
  allocator<char> local_319;
  string local_318 [32];
  reference local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  undefined1 *local_2e0;
  string local_2d8 [32];
  undefined1 local_2b8 [31];
  undefined1 local_299;
  undefined1 local_298 [16];
  string local_288 [32];
  fpos local_268 [23];
  allocator<char> local_251;
  int local_250 [2];
  string local_248 [39];
  allocator<char> local_221;
  size_t in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  string local_200 [32];
  char *local_1e0;
  char **local_1d8;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_1d0;
  long local_1c8;
  ostringstream local_1c0 [399];
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (char)((ulong)in_stack_fffffffffffffc10 >> 0x38),
             (allocator<char> *)in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  local_1c8 = in_RSI + 0x60;
  local_1d0._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                           in_stack_fffffffffffffbf8);
  local_1d8 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                  in_stack_fffffffffffffbf8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)in_stack_fffffffffffffc00,
                            (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)in_stack_fffffffffffffbf8), bVar2) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_1d0);
    pcVar1 = *ppcVar3;
    local_1e0 = pcVar1;
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::front
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffc00);
    if (pcVar1 == *ppcVar4) {
      sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RSI + 0x60));
      if (sVar5 == 1) {
        std::operator<<((ostream *)local_1c0,local_1e0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
        std::allocator<char>::~allocator(&local_221);
        local_250[1] = 0;
        local_250[0] = std::__cxx11::string::size();
        local_250[0] = 7 - local_250[0];
        std::max<int>(local_250 + 1,local_250);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                   (char)((ulong)in_stack_fffffffffffffc10 >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffc08);
        std::allocator<char>::~allocator(&local_251);
        poVar6 = std::operator<<((ostream *)local_1c0,local_200);
        std::operator<<(poVar6,local_248);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_200);
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)local_1c0,local_1e0);
      pcVar1 = local_1e0;
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::back
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                           in_stack_fffffffffffffc00);
      pcVar9 = "";
      if (pcVar1 != *ppcVar4) {
        pcVar9 = ", ";
      }
      std::operator<<(poVar6,pcVar9);
    }
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++(&local_1d0);
  }
  if (*(long *)(in_RSI + 0x78) != 0) {
    poVar6 = std::operator<<((ostream *)local_1c0," ");
    std::operator<<(poVar6,*(char **)(in_RSI + 0x78));
  }
  if (*(long *)(in_RSI + 0x80) != 0) {
    poVar6 = std::operator<<((ostream *)local_1c0," ");
    std::operator<<(poVar6,*(char **)(in_RSI + 0x80));
  }
  local_268._0_16_ = std::ostream::tellp();
  sVar7 = std::fpos::operator_cast_to_long(local_268);
  if (sVar7 < 0x26) {
    in_stack_fffffffffffffc30 = (allocator<char> *)std::__cxx11::string::size();
    auVar10 = std::ostream::tellp();
    local_298 = auVar10;
    sVar7 = std::fpos::operator_cast_to_long((fpos *)local_298);
    __n = (long)in_stack_fffffffffffffc30 - sVar7;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_299;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,__n,(char)((ulong)in_stack_fffffffffffffc10 >> 0x38),
               (allocator<char> *)in_stack_fffffffffffffc08);
    std::operator<<((ostream *)local_1c0,local_288);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
  else {
    poVar6 = std::operator<<((ostream *)local_1c0,"\n");
    std::operator<<(poVar6,local_30);
    auVar10._8_8_ = in_stack_fffffffffffffc38;
    auVar10._0_8_ = in_stack_fffffffffffffc40;
  }
  std::__cxx11::string::string(local_2d8,(string *)(in_RSI + 0x90));
  break_str_into_lines(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_2d8);
  local_2e0 = local_2b8;
  local_2e8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbf8);
  local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbf8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffc00,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffbf8);
    if (!bVar2) break;
    in_stack_fffffffffffffc10 =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&local_2e8);
    local_2f8 = in_stack_fffffffffffffc10;
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc00);
    local_31a = in_stack_fffffffffffffc10 != pvVar8;
    if (local_31a) {
      std::__cxx11::string::string(local_318,local_30);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (auVar10._0_8_,auVar10._8_8_,in_stack_fffffffffffffc30);
    }
    local_31a = !local_31a;
    in_stack_fffffffffffffc00 = std::operator<<((ostream *)local_1c0,local_318);
    in_stack_fffffffffffffbf8 = std::operator<<(in_stack_fffffffffffffc00,(string *)local_2f8);
    std::operator<<(in_stack_fffffffffffffbf8,"\n");
    std::__cxx11::string::~string(local_318);
    if (local_31a) {
      std::allocator<char>::~allocator(&local_319);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_2e8);
  }
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc10);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string common_arg::to_string() {
    // params for printing to console
    const static int n_leading_spaces = 40;
    const static int n_char_per_line_help = 70; // TODO: detect this based on current console
    std::string leading_spaces(n_leading_spaces, ' ');

    std::ostringstream ss;
    for (const auto arg : args) {
        if (arg == args.front()) {
            if (args.size() == 1) {
                ss << arg;
            } else {
                // first arg is usually abbreviation, we need padding to make it more beautiful
                auto tmp = std::string(arg) + ", ";
                auto spaces = std::string(std::max(0, 7 - (int)tmp.size()), ' ');
                ss << tmp << spaces;
            }
        } else {
            ss << arg << (arg != args.back() ? ", " : "");
        }
    }
    if (value_hint) ss << " " << value_hint;
    if (value_hint_2) ss << " " << value_hint_2;
    if (ss.tellp() > n_leading_spaces - 3) {
        // current line is too long, add new line
        ss << "\n" << leading_spaces;
    } else {
        // padding between arg and help, same line
        ss << std::string(leading_spaces.size() - ss.tellp(), ' ');
    }
    const auto help_lines = break_str_into_lines(help, n_char_per_line_help);
    for (const auto & line : help_lines) {
        ss << (&line == &help_lines.front() ? "" : leading_spaces) << line << "\n";
    }
    return ss.str();
}